

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint bucketCount;
  uint uVar1;
  EntryType *dst;
  long lVar2;
  int i;
  long lVar3;
  ulong local_60;
  Type *local_58;
  uint local_4c;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  uVar1 = this->count * 2;
  local_34[0] = 0x4b;
  bucketCount = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetBucketSize(uVar1,local_34);
  local_48 = (int *)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,uVar1,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>>,Memory::Recycler>
              (dst,(long)(int)uVar1,&this->entries,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::
    WriteBarrierPtr<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>_>_>
    ::WriteBarrierSet(&this->entries,dst);
    this->size = uVar1;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,bucketCount,uVar1);
    local_58 = &this->entries;
    local_4c = uVar1;
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>>,Memory::Recycler>
              ((SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>_>
                *)newBuckets,(long)(int)uVar1,local_58,(long)this->count);
    this->modFunctionIndex = local_34[0];
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < this->count; lVar3 = lVar3 + 1) {
      if (-2 < *(int *)((long)newBuckets + lVar2 + 8)) {
        ValueToKey<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>_>
        ::ToKey((ValueToKey<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>_>
                 *)&local_60,
                (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_> *)
                ((long)newBuckets + lVar2));
        uVar1 = GetBucket((uint)(local_60 >> 3) | 1,bucketCount,this->modFunctionIndex);
        *(int *)((long)newBuckets + lVar2 + 8) = local_48[(int)uVar1];
        local_48[(int)uVar1] = (int)lVar3;
      }
      lVar2 = lVar2 + 0x10;
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar1 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->buckets,local_48);
    Memory::
    WriteBarrierPtr<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>_>_>
    ::WriteBarrierSet(local_58,(SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>_>
                                *)newBuckets);
    this->bucketCount = bucketCount;
    this->size = uVar1;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }